

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

double __thiscall Catch::anon_unknown_2::Duration::value(Duration *this)

{
  Duration *this_local;
  
  switch(this->m_units) {
  case Microseconds:
    this_local = (Duration *)(this->m_inNanoseconds / 1000.0);
    break;
  case Milliseconds:
    this_local = (Duration *)(this->m_inNanoseconds / 1000000.0);
    break;
  case Seconds:
    this_local = (Duration *)(this->m_inNanoseconds / 1000000000.0);
    break;
  case Minutes:
    this_local = (Duration *)(this->m_inNanoseconds / 60000000000.0);
    break;
  default:
    this_local = (Duration *)this->m_inNanoseconds;
  }
  return (double)this_local;
}

Assistant:

auto value() const -> double {
        switch (m_units) {
        case Unit::Microseconds:
            return m_inNanoseconds / static_cast<double>(s_nanosecondsInAMicrosecond);
        case Unit::Milliseconds:
            return m_inNanoseconds / static_cast<double>(s_nanosecondsInAMillisecond);
        case Unit::Seconds:
            return m_inNanoseconds / static_cast<double>(s_nanosecondsInASecond);
        case Unit::Minutes:
            return m_inNanoseconds / static_cast<double>(s_nanosecondsInAMinute);
        default:
            return m_inNanoseconds;
        }
    }